

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

int32_t decCompare(decNumber *lhs,decNumber *rhs,uint8_t abs_c)

{
  decNumber *pdVar1;
  int32_t iVar2;
  uint blength;
  byte bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = 1;
  if ((lhs->lsu[0] == '\0') && (lhs->digits == 1)) {
    bVar7 = (lhs->bits & 0x70) == 0;
    uVar6 = (uint)!bVar7;
  }
  else {
    bVar7 = false;
  }
  if (abs_c == '\0') {
    iVar4 = 0;
    if (!bVar7) {
      iVar4 = (uint)(-1 < (char)lhs->bits) * 2 + -1;
    }
    if (((rhs->lsu[0] == '\0') && (rhs->digits == 1)) && ((rhs->bits & 0x70) == 0)) {
      iVar5 = 0;
    }
    else {
      iVar5 = (uint)(-1 < (char)rhs->bits) * 2 + -1;
    }
    if (iVar5 < iVar4) {
      return 1;
    }
    if (bVar7 || iVar4 < iVar5) {
      return -(uint)(iVar4 < iVar5);
    }
  }
  else if ((rhs->lsu[0] == '\0') && (rhs->digits == 1)) {
    bVar3 = rhs->bits & 0x70;
    iVar4 = 1;
    if (bVar3 == 0 || bVar7) {
      return -(uint)(bVar3 != 0) | uVar6;
    }
  }
  else {
    iVar4 = 1;
    if (bVar7) {
      return -1;
    }
  }
  if (((rhs->bits | lhs->bits) & 0x40) == 0) {
    iVar5 = -iVar4;
    pdVar1 = lhs;
    if (lhs->exponent <= rhs->exponent) {
      iVar5 = iVar4;
      pdVar1 = rhs;
      rhs = lhs;
    }
    uVar6 = rhs->digits;
    if ((long)(int)uVar6 < 0x32) {
      uVar6 = (uint)""[(int)uVar6];
    }
    blength = pdVar1->digits;
    if ((long)(int)blength < 0x32) {
      blength = (uint)""[(int)blength];
    }
    iVar2 = decUnitCompare(rhs->lsu,uVar6,pdVar1->lsu,blength,pdVar1->exponent - rhs->exponent);
    return iVar5 * iVar2;
  }
  if ((rhs->bits & 0x40) != 0) {
    iVar2 = 0;
    if ((lhs->bits & 0x40) == 0) {
      iVar2 = -iVar4;
    }
    return iVar2;
  }
  return iVar4;
}

Assistant:

static Int decCompare(const decNumber *lhs, const decNumber *rhs,
                      Flag abs_c) {
  Int   result;                    /* result value  */
  Int   sigr;                      /* rhs signum  */
  Int   compare;                   /* work  */

  result=1;                                  /* assume signum(lhs)  */
  if (ISZERO(lhs)) result=0;
  if (abs_c) {
    if (ISZERO(rhs)) return result;          /* LHS wins or both 0  */
    /* RHS is non-zero  */
    if (result==0) return -1;                /* LHS is 0; RHS wins  */
    /* [here, both non-zero, result=1]  */
    }
   else {                                    /* signs matter  */
    if (result && decNumberIsNegative(lhs)) result=-1;
    sigr=1;                                  /* compute signum(rhs)  */
    if (ISZERO(rhs)) sigr=0;
     else if (decNumberIsNegative(rhs)) sigr=-1;
    if (result > sigr) return +1;            /* L > R, return 1  */
    if (result < sigr) return -1;            /* L < R, return -1  */
    if (result==0) return 0;                   /* both 0  */
    }

  /* signums are the same; both are non-zero  */
  if ((lhs->bits | rhs->bits) & DECINF) {    /* one or more infinities  */
    if (decNumberIsInfinite(rhs)) {
      if (decNumberIsInfinite(lhs)) result=0;/* both infinite  */
       else result=-result;                  /* only rhs infinite  */
      }
    return result;
    }
  /* must compare the coefficients, allowing for exponents  */
  if (lhs->exponent>rhs->exponent) {         /* LHS exponent larger  */
    /* swap sides, and sign  */
    const decNumber *temp=lhs;
    lhs=rhs;
    rhs=temp;
    result=-result;
    }
  compare=decUnitCompare(lhs->lsu, D2U(lhs->digits),
                         rhs->lsu, D2U(rhs->digits),
                         rhs->exponent-lhs->exponent);
  if (compare!=BADINT) compare*=result;      /* comparison succeeded  */
  return compare;
  }